

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
               (IntegerDecimalCastData<short> *state,int16_t exponent)

{
  StoreType *result;
  uint16_t uVar1;
  bool bVar2;
  long lVar3;
  int64_t right;
  uint16_t uVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  
  sVar7 = exponent;
  if (exponent < 0) {
    lVar3 = state->result;
    for (; (lVar3 != 0 && (exponent < 0)); exponent = exponent + 1) {
      state->decimal = lVar3 % 10;
      state->result = lVar3 / 10;
      lVar3 = lVar3 / 10;
    }
    if (state->decimal < 0) {
      state->decimal = -state->decimal;
    }
    state->decimal_digits = 1;
    goto LAB_00252d45;
  }
  while ((lVar3 = state->result, lVar3 != 0 && (0 < sVar7))) {
    bVar2 = TryMultiplyOperator::Operation<long,long,long>(lVar3,10,&state->result);
    sVar7 = sVar7 + -1;
    if (!bVar2) {
      return false;
    }
  }
  lVar5 = state->decimal;
  if (lVar5 == 0) goto LAB_00252d45;
  result = &state->decimal;
  uVar1 = state->decimal_digits;
  if ((short)(exponent - uVar1) < 0) {
    if ((ushort)(exponent - uVar1) < 0xffed) {
      *result = 0;
      right = 0;
      goto LAB_00252d07;
    }
    lVar6 = 1;
    for (uVar4 = exponent; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      lVar6 = lVar6 * 10;
    }
    right = lVar5 / lVar6;
    lVar5 = lVar5 % lVar6;
    *result = right;
  }
  else {
    sVar7 = (exponent - uVar1) + 1;
    while (sVar7 = sVar7 + -1, 0 < sVar7) {
      bVar2 = TryMultiplyOperator::Operation<long,long,long>(*result,10,result);
      if (!bVar2) {
        return false;
      }
    }
    uVar1 = state->decimal_digits;
    lVar3 = state->result;
    right = state->decimal;
LAB_00252d07:
    lVar5 = 0;
  }
  state->decimal_digits = uVar1 - exponent;
  bVar2 = TrySubtractOperator::Operation<long,long,long>(lVar3,right,&state->result);
  if (!bVar2) {
    return false;
  }
  *result = lVar5;
LAB_00252d45:
  bVar2 = Finalize<duckdb::IntegerDecimalCastData<short>,true>(state);
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int16_t exponent) {
		using store_t = typename T::StoreType;

		int16_t e = exponent;
		// Negative Exponent
		if (e < 0) {
			while (state.result != 0 && e++ < 0) {
				state.decimal = state.result % 10;
				state.result /= 10;
			}
			if (state.decimal < 0) {
				state.decimal = -state.decimal;
			}
			state.decimal_digits = 1;
			return Finalize<T, NEGATIVE>(state);
		}

		// Positive Exponent
		while (state.result != 0 && e-- > 0) {
			if (!TryMultiplyOperator::Operation(state.result, (store_t)10, state.result)) {
				return false;
			}
		}

		if (state.decimal == 0) {
			return Finalize<T, NEGATIVE>(state);
		}

		// Handle decimals
		e = UnsafeNumericCast<int16_t>(exponent - state.decimal_digits);
		store_t remainder = 0;
		if (e < 0) {
			if (static_cast<uint16_t>(-e) <= NumericLimits<store_t>::Digits()) {
				store_t power = 1;
				while (e++ < 0) {
					power *= 10;
				}
				remainder = state.decimal % power;
				state.decimal /= power;
			} else {
				state.decimal = 0;
			}
		} else {
			while (e-- > 0) {
				if (!TryMultiplyOperator::Operation(state.decimal, (store_t)10, state.decimal)) {
					return false;
				}
			}
		}

		state.decimal_digits -= exponent;

		if (NEGATIVE) {
			if (!TrySubtractOperator::Operation(state.result, state.decimal, state.result)) {
				return false;
			}
		} else if (!TryAddOperator::Operation(state.result, state.decimal, state.result)) {
			return false;
		}
		state.decimal = remainder;
		return Finalize<T, NEGATIVE>(state);
	}